

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine_test.c
# Opt level: O0

int test_encode_char(void)

{
  int iVar1;
  char local_a8 [8];
  anon_struct_16_2_320565c7 encode_map [9];
  int i;
  char encoded_char [10];
  
  memcpy(local_a8,&DAT_00108d60,0x90);
  for (encode_map[8].result._0_4_ = 0; *(long *)(encode_map + (int)encode_map[8].result) != 0;
      encode_map[8].result._0_4_ = (int)encode_map[8].result + 1) {
    statemachine_encode_char
              (*(char *)&encode_map[(long)(int)encode_map[8].result + -1].result,
               (char *)((long)&encode_map[8].result + 6),10);
    iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),
                   *(char **)(encode_map + (int)encode_map[8].result));
    if (iVar1 != 0) {
      printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
             ,0x14e,(undefined1 *)((long)&encode_map[8].result + 6),
             *(undefined8 *)(encode_map + (int)encode_map[8].result));
      iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),
                     *(char **)(encode_map + (int)encode_map[8].result));
      if (iVar1 == 0) {
        exit(1);
      }
      __assert_fail("!strcmp((encoded_char), (encode_map[i].result))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                    ,0x14e,"int test_encode_char()");
    }
  }
  statemachine_encode_char(-1,(char *)((long)&encode_map[8].result + 6),1);
  iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"");
  if (iVar1 != 0) {
    printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x152,(undefined1 *)((long)&encode_map[8].result + 6),"");
    iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"");
    if (iVar1 == 0) {
      exit(1);
    }
    __assert_fail("!strcmp((encoded_char), (\"\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x152,"int test_encode_char()");
  }
  statemachine_encode_char(-1,(char *)((long)&encode_map[8].result + 6),2);
  iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\");
  if (iVar1 != 0) {
    printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x155,(undefined1 *)((long)&encode_map[8].result + 6),"\\");
    iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\");
    if (iVar1 == 0) {
      exit(1);
    }
    __assert_fail("!strcmp((encoded_char), (\"\\\\\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x155,"int test_encode_char()");
  }
  statemachine_encode_char(-1,(char *)((long)&encode_map[8].result + 6),3);
  iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\x");
  if (iVar1 != 0) {
    printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x158,(undefined1 *)((long)&encode_map[8].result + 6),"\\x");
    iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\x");
    if (iVar1 == 0) {
      exit(1);
    }
    __assert_fail("!strcmp((encoded_char), (\"\\\\x\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x158,"int test_encode_char()");
  }
  statemachine_encode_char(-1,(char *)((long)&encode_map[8].result + 6),4);
  iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\xf");
  if (iVar1 != 0) {
    printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x15b,(undefined1 *)((long)&encode_map[8].result + 6),"\\xf");
    iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\xf");
    if (iVar1 == 0) {
      exit(1);
    }
    __assert_fail("!strcmp((encoded_char), (\"\\\\xf\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x15b,"int test_encode_char()");
  }
  statemachine_encode_char(-1,(char *)((long)&encode_map[8].result + 6),5);
  iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\xff");
  if (iVar1 == 0) {
    return 0;
  }
  printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
         ,0x15e,(undefined1 *)((long)&encode_map[8].result + 6),"\\xff");
  iVar1 = strcmp((char *)((long)&encode_map[8].result + 6),"\\xff");
  if (iVar1 == 0) {
    exit(1);
  }
  __assert_fail("!strcmp((encoded_char), (\"\\\\xff\"))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                ,0x15e,"int test_encode_char()");
}

Assistant:

int test_encode_char()
{
  char encoded_char[10];
  int i;

  struct {
    char chr;
    const char *result;
  } encode_map[] = {
    { 'x', "x" },
    { '0', "0" },
    { '\n', "\\n" },
    { '\r', "\\r" },
    { '\t', "\\t" },
    { '\\', "\\\\" },
    { '\0', "\\x00" },
    { '\xF0', "\\xf0" },
    { '\0', NULL}  // Terminates when output == NULL
  };

  for (i = 0; encode_map[i].result; i++) {
    statemachine_encode_char(encode_map[i].chr, encoded_char,
                             sizeof(encoded_char) / sizeof(*encoded_char));
    ASSERT_STREQ(encoded_char, encode_map[i].result);
  }

  statemachine_encode_char('\xFF', encoded_char, 1);
  ASSERT_STREQ(encoded_char, "");

  statemachine_encode_char('\xFF', encoded_char, 2);
  ASSERT_STREQ(encoded_char, "\\");

  statemachine_encode_char('\xFF', encoded_char, 3);
  ASSERT_STREQ(encoded_char, "\\x");

  statemachine_encode_char('\xFF', encoded_char, 4);
  ASSERT_STREQ(encoded_char, "\\xf");

  statemachine_encode_char('\xFF', encoded_char, 5);
  ASSERT_STREQ(encoded_char, "\\xff");

  return 0;
}